

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_iterator_suite.cpp
# Opt level: O0

void key_iterator_suite::iterate_null(void)

{
  undefined1 *this;
  bool v;
  key_iterator local_e8;
  undefined1 local_88 [8];
  key_iterator where;
  variable data;
  
  this = &where.index.storage.field_0x28;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)this);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_begin
            ((key_iterator *)local_88,(basic_variable<std::allocator<char>_> *)this);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_end
            (&local_e8,(basic_variable<std::allocator<char>_> *)&where.index.storage.field_0x28);
  v = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator==
                ((key_iterator *)local_88,&local_e8);
  boost::detail::test_impl
            ("where == data.key_end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xbe7,"void key_iterator_suite::iterate_null()",v);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator
            ((key_iterator *)local_88);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&where.index.storage.field_0x28);
  return;
}

Assistant:

void iterate_null()
{
    variable data;
    auto where = data.key_begin();
    TRIAL_PROTOCOL_TEST(where == data.key_end());
}